

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ncnn2table.cpp
# Opt level: O2

vector<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>
* parse_comma_float_array_list
            (vector<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>
             *__return_storage_ptr__,char *s)

{
  int iVar1;
  int iVar2;
  char *pcVar3;
  int nconsumed;
  float v_1;
  float v;
  vector<float,_std::allocator<float>_> af;
  char vstr [20];
  int local_7c;
  vector<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>
  *local_78;
  float local_70;
  float local_6c;
  _Vector_base<float,_std::allocator<float>_> local_68;
  char local_48 [24];
  
  (__return_storage_ptr__->
  super__Vector_base<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>
  )._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->
  super__Vector_base<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>
  )._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (__return_storage_ptr__->
  super__Vector_base<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>
  )._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_78 = __return_storage_ptr__;
  pcVar3 = strtok(s,"[]");
  while (pcVar3 != (char *)0x0) {
    local_7c = 0;
    iVar2 = __isoc99_sscanf(pcVar3,"%19[^,]%n",local_48,&local_7c);
    iVar1 = local_7c;
    if (iVar2 == 1) {
      local_68._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
      local_68._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
      local_68._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      local_6c = vstr_to_float(local_48);
      std::vector<float,_std::allocator<float>_>::push_back
                ((vector<float,_std::allocator<float>_> *)&local_68,&local_6c);
      while( true ) {
        pcVar3 = pcVar3 + iVar1;
        iVar2 = __isoc99_sscanf(pcVar3,",%19[^,]%n",local_48,&local_7c);
        iVar1 = local_7c;
        if (iVar2 != 1) break;
        local_70 = vstr_to_float(local_48);
        std::vector<float,_std::allocator<float>_>::push_back
                  ((vector<float,_std::allocator<float>_> *)&local_68,&local_70);
      }
      std::
      vector<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>
      ::push_back(local_78,(value_type *)&local_68);
      std::_Vector_base<float,_std::allocator<float>_>::~_Vector_base(&local_68);
    }
    pcVar3 = strtok((char *)0x0,"[]");
  }
  return local_78;
}

Assistant:

static std::vector<std::vector<float> > parse_comma_float_array_list(char* s)
{
    std::vector<std::vector<float> > aaf;

    char* pch = strtok(s, "[]");
    while (pch != NULL)
    {
        // parse a,b,c
        char vstr[20];
        int nconsumed = 0;
        int nscan = sscanf(pch, "%19[^,]%n", vstr, &nconsumed);
        if (nscan == 1)
        {
            // ok we get array
            pch += nconsumed;

            std::vector<float> af;
            float v = vstr_to_float(vstr);
            af.push_back(v);

            nscan = sscanf(pch, ",%19[^,]%n", vstr, &nconsumed);
            while (nscan == 1)
            {
                pch += nconsumed;

                float v = vstr_to_float(vstr);
                af.push_back(v);

                nscan = sscanf(pch, ",%19[^,]%n", vstr, &nconsumed);
            }

            // array end
            aaf.push_back(af);
        }

        pch = strtok(NULL, "[]");
    }

    return aaf;
}